

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

EnumPort * __thiscall
kratos::Generator::port
          (Generator *this,PortDirection direction,string *port_name,shared_ptr<kratos::Enum> *def)

{
  element_type *peVar1;
  iterator iVar2;
  VarException *this_00;
  mapped_type *pmVar3;
  UserException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::EnumPort> sVar4;
  basic_string_view<char> bVar5;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_80;
  string local_78;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::EnumPort> p;
  PortDirection local_30;
  allocator_type local_29;
  PortDirection direction_local;
  
  local_30 = direction;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->ports_)._M_t,port_name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->ports_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    auStack_58 = (undefined1  [8])(port_name->_M_dataplus)._M_p;
    p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)port_name->_M_string_length;
    p.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_dataplus._M_p;
    bVar5 = fmt::v7::to_string_view<char,_0>("{0} already exists in {1}");
    format_str.data_ = (char *)bVar5.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_58;
    fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar5.data_,format_str,args);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
             ::at(&this->vars_,port_name);
    local_80 = (pmVar3->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_80;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58
               ,__l,&local_29);
    VarException::VarException
              (this_00,&local_78,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58
              );
    __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((def->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->local_ != true)
  {
    local_78._M_dataplus._M_p = (pointer)this;
    sVar4 = std::
            make_shared<kratos::EnumPort,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>const&>
                      ((Generator **)auStack_58,(PortDirection *)&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_30,(shared_ptr<kratos::Enum> *)port_name);
    (*(this->super_IRNode)._vptr_IRNode[7])
              (this,port_name,
               sVar4.super___shared_ptr<kratos::EnumPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumPort>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,port_name,(shared_ptr<kratos::EnumPort> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    return (EnumPort *)(Generator *)auStack_58;
  }
  this_01 = (UserException *)__cxa_allocate_exception(0x10);
  peVar1 = (def->super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78._M_dataplus._M_p = (peVar1->name)._M_dataplus._M_p;
  local_78._M_string_length = (peVar1->name)._M_string_length;
  bVar5 = fmt::v7::to_string_view<char,_0>("Cannot use {0} as port type since it\'s local");
  format_str_00.data_ = (char *)bVar5.size_;
  format_str_00.size_ = 0xd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)auStack_58,(detail *)bVar5.data_,format_str_00,args_00);
  UserException::UserException(this_01,(string *)auStack_58);
  __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EnumPort &Generator::port(kratos::PortDirection direction, const std::string &port_name,
                          const std::shared_ptr<kratos::Enum> &def) {
    if (ports_.find(port_name) != ports_.end())
        throw VarException(::format("{0} already exists in {1}", port_name, name),
                           {vars_.at(port_name).get()});
    // make sure the enum def is not local
    if (def->local())
        throw UserException(::format("Cannot use {0} as port type since it's local", def->name));
    auto p = std::make_shared<EnumPort>(this, direction, port_name, def);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}